

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

Node * __thiscall State::GetNode(State *this,StringPiece path,uint64_t slash_bits)

{
  Node *pNVar1;
  string *str;
  mapped_type *ppNVar2;
  StringPiece local_88;
  undefined1 local_75;
  string local_68;
  State *local_48;
  char *local_40;
  Node *local_38;
  Node *node;
  uint64_t slash_bits_local;
  State *this_local;
  StringPiece path_local;
  
  local_40 = (char *)path.len_;
  local_48 = (State *)path.str_;
  node = (Node *)slash_bits;
  slash_bits_local = (uint64_t)this;
  this_local = local_48;
  path_local.str_ = local_40;
  local_38 = LookupNode(this,path);
  path_local.len_ = (size_t)local_38;
  if (local_38 == (Node *)0x0) {
    pNVar1 = (Node *)operator_new(0x60);
    local_75 = 1;
    StringPiece::AsString_abi_cxx11_(&local_68,(StringPiece *)&this_local);
    Node::Node(pNVar1,&local_68,(uint64_t)node);
    local_75 = 0;
    local_38 = pNVar1;
    std::__cxx11::string::~string((string *)&local_68);
    pNVar1 = local_38;
    str = Node::path_abi_cxx11_(local_38);
    StringPiece::StringPiece(&local_88,str);
    ppNVar2 = std::
              unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
              ::operator[](&this->paths_,&local_88);
    *ppNVar2 = pNVar1;
    path_local.len_ = (size_t)local_38;
  }
  return (Node *)path_local.len_;
}

Assistant:

Node* State::GetNode(StringPiece path, uint64_t slash_bits) {
  Node* node = LookupNode(path);
  if (node)
    return node;
  node = new Node(path.AsString(), slash_bits);
  paths_[node->path()] = node;
  return node;
}